

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stats.c
# Opt level: O2

void mutex_stats_init_cols
               (emitter_row_t *row,char *table_name,emitter_col_t *name,emitter_col_t *col_uint64_t,
               emitter_col_t *col_uint32_t)

{
  if (name != (emitter_col_t *)0x0) {
    emitter_col_init(name,row);
    name->justify = emitter_justify_left;
    name->width = 0x15;
    name->type = emitter_type_title;
    (name->field_3).str_val = table_name;
  }
  emitter_col_init(col_uint64_t,row);
  col_uint64_t->justify = emitter_justify_right;
  col_uint64_t->width = 0x10;
  col_uint64_t->type = emitter_type_title;
  (col_uint64_t->field_3).str_val = "n_lock_ops";
  emitter_col_init(col_uint64_t + 1,row);
  col_uint64_t[1].justify = emitter_justify_right;
  col_uint64_t[1].width = 8;
  col_uint64_t[1].type = emitter_type_title;
  col_uint64_t[1].field_3.str_val = "(#/sec)";
  emitter_col_init(col_uint64_t + 2,row);
  col_uint64_t[2].justify = emitter_justify_right;
  col_uint64_t[2].width = 0x10;
  col_uint64_t[2].type = emitter_type_title;
  col_uint64_t[2].field_3.str_val = "n_waiting";
  emitter_col_init(col_uint64_t + 3,row);
  col_uint64_t[3].justify = emitter_justify_right;
  col_uint64_t[3].width = 8;
  col_uint64_t[3].type = emitter_type_title;
  col_uint64_t[3].field_3.str_val = "(#/sec)";
  emitter_col_init(col_uint64_t + 4,row);
  col_uint64_t[4].justify = emitter_justify_right;
  col_uint64_t[4].width = 0x10;
  col_uint64_t[4].type = emitter_type_title;
  col_uint64_t[4].field_3.str_val = "n_spin_acq";
  emitter_col_init(col_uint64_t + 5,row);
  col_uint64_t[5].justify = emitter_justify_right;
  col_uint64_t[5].width = 8;
  col_uint64_t[5].type = emitter_type_title;
  col_uint64_t[5].field_3.str_val = "(#/sec)";
  emitter_col_init(col_uint64_t + 6,row);
  col_uint64_t[6].justify = emitter_justify_right;
  col_uint64_t[6].width = 0x10;
  col_uint64_t[6].type = emitter_type_title;
  col_uint64_t[6].field_3.str_val = "n_owner_switch";
  emitter_col_init(col_uint64_t + 7,row);
  col_uint64_t[7].justify = emitter_justify_right;
  col_uint64_t[7].width = 8;
  col_uint64_t[7].type = emitter_type_title;
  col_uint64_t[7].field_3.str_val = "(#/sec)";
  emitter_col_init(col_uint64_t + 8,row);
  col_uint64_t[8].justify = emitter_justify_right;
  col_uint64_t[8].width = 0x10;
  col_uint64_t[8].type = emitter_type_title;
  col_uint64_t[8].field_3.str_val = "total_wait_ns";
  emitter_col_init(col_uint64_t + 9,row);
  col_uint64_t[9].justify = emitter_justify_right;
  col_uint64_t[9].width = 8;
  col_uint64_t[9].type = emitter_type_title;
  col_uint64_t[9].field_3.str_val = "(#/sec)";
  emitter_col_init(col_uint64_t + 10,row);
  col_uint64_t[10].justify = emitter_justify_right;
  col_uint64_t[10].width = 0x10;
  col_uint64_t[10].type = emitter_type_title;
  col_uint64_t[10].field_3.str_val = "max_wait_ns";
  emitter_col_init(col_uint32_t,row);
  col_uint32_t->justify = emitter_justify_right;
  col_uint32_t->width = 0xc;
  col_uint32_t->type = emitter_type_title;
  (col_uint32_t->field_3).str_val = "max_n_thds";
  col_uint64_t[9].width = 10;
  return;
}

Assistant:

static void
mutex_stats_init_cols(emitter_row_t *row, const char *table_name,
    emitter_col_t *name,
    emitter_col_t col_uint64_t[mutex_prof_num_uint64_t_counters],
    emitter_col_t col_uint32_t[mutex_prof_num_uint32_t_counters]) {
	mutex_prof_uint64_t_counter_ind_t k_uint64_t = 0;
	mutex_prof_uint32_t_counter_ind_t k_uint32_t = 0;

	emitter_col_t *col;

	if (name != NULL) {
		emitter_col_init(name, row);
		name->justify = emitter_justify_left;
		name->width = 21;
		name->type = emitter_type_title;
		name->str_val = table_name;
	}

#define WIDTH_uint32_t 12
#define WIDTH_uint64_t 16
#define OP(counter, counter_type, human, derived, base_counter)		\
	col = &col_##counter_type[k_##counter_type];			\
	++k_##counter_type;						\
	emitter_col_init(col, row);					\
	col->justify = emitter_justify_right;				\
	col->width = derived ? 8 : WIDTH_##counter_type;		\
	col->type = emitter_type_title;					\
	col->str_val = human;
	MUTEX_PROF_COUNTERS
#undef OP
#undef WIDTH_uint32_t
#undef WIDTH_uint64_t
	col_uint64_t[mutex_counter_total_wait_time_ps].width = 10;
}